

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scv.c
# Opt level: O2

scv_vector * scv_new(size_t objsize,size_t capacity)

{
  scv_vector *__ptr;
  void *pvVar1;
  size_t __size;
  ulong uVar2;
  
  uVar2 = capacity + (capacity == 0);
  if (objsize != 0) {
    if (0xffffffffffffffff / objsize <= uVar2) {
      return (scv_vector *)0x0;
    }
    __ptr = (scv_vector *)malloc(0x20);
    if (__ptr != (scv_vector *)0x0) {
      __size = uVar2 * objsize;
      if (__size < 0x40) {
        uVar2 = (objsize + 0x3f) / objsize;
        __size = uVar2 * objsize;
      }
      pvVar1 = malloc(__size);
      __ptr->data = pvVar1;
      if (pvVar1 != (void *)0x0) {
        __ptr->objsize = objsize;
        __ptr->size = 0;
        __ptr->capacity = uVar2;
        return __ptr;
      }
      free(__ptr);
    }
  }
  return (scv_vector *)0x0;
}

Assistant:

struct scv_vector *scv_new(size_t objsize, size_t capacity)
{
	struct scv_vector *v;

	if (capacity == 0) {
		capacity = 1;
	}

	if (objsize == 0 || capacity >= (size_t) -1 / objsize) {
		return NULL;
	}

	v = (struct scv_vector *) malloc(sizeof *v);

	if (v == NULL) {
		return NULL;
	}

	/* Minimum capacity is SCV_MIN_ALLOC bytes or 1 element */
	if (capacity * objsize < SCV_MIN_ALLOC) {
		capacity = (SCV_MIN_ALLOC + (objsize - 1)) / objsize;
	}

	v->data = malloc(capacity * objsize);

	if (v->data == NULL) {
		free(v);
		return NULL;
	}

	v->objsize = objsize;
	v->size = 0;
	v->capacity = capacity;

	return v;
}